

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::mergeQualifiers(HlslParseContext *this,TQualifier *dst,TQualifier *src)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar1 = *(ulong *)&dst->field_0x8;
  uVar3 = (uint)uVar1 & 0x7f;
  if (uVar3 < 2) {
    uVar1 = uVar1 & 0xffffffffffffff80 | (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
  }
  else if ((uVar3 == 0x10) && ((*(uint *)&src->field_0x8 & 0x7f) == 0x11)) {
LAB_00313014:
    uVar1 = uVar1 & 0xffffffffffffff80 | 0x12;
  }
  else {
    uVar3 = (uint)uVar1 & 0x7f;
    if (uVar3 == 2) {
      if ((*(uint *)&src->field_0x8 & 0x7f) != 0x10) goto LAB_00313044;
    }
    else {
      if (uVar3 != 0x10) {
        if ((uVar3 != 0x11) || ((*(uint *)&src->field_0x8 & 0x7f) != 0x10)) goto LAB_00313044;
        goto LAB_00313014;
      }
      if ((*(uint *)&src->field_0x8 & 0x7f) != 2) goto LAB_00313044;
    }
    uVar1 = uVar1 & 0xffffffffffffff80 | 0x13;
  }
  *(ulong *)&dst->field_0x8 = uVar1;
LAB_00313044:
  mergeObjectLayoutQualifiers(this,dst,src,false);
  uVar1 = *(ulong *)&dst->field_0x8;
  uVar2 = (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x10000000);
  *(ulong *)&dst->field_0x8 = uVar2 | uVar1;
  uVar7 = (*(ulong *)&src->field_0x8 | uVar1) & 0x1000000000;
  *(ulong *)&dst->field_0x8 = uVar2 | uVar1 & 0xffffffefffffffff | uVar7;
  uVar3 = (uint)uVar1;
  uVar4 = (ulong)((*(uint *)&src->field_0x8 | uVar3) & 0x20000000);
  *(ulong *)&dst->field_0x8 = uVar2 | uVar1 & 0xffffffefdfffffff | uVar7 | uVar4;
  uVar5 = (ulong)((*(uint *)&src->field_0x8 | uVar3) & 0x40000000);
  *(ulong *)&dst->field_0x8 = uVar2 | uVar1 & 0xffffffef9fffffff | uVar7 | uVar4 | uVar5;
  uVar6 = (ulong)((*(uint *)&src->field_0x8 | uVar3) & 0x80000000);
  *(ulong *)&dst->field_0x8 = uVar2 | uVar1 & 0xffffffef1fffffff | uVar7 | uVar4 | uVar5 | uVar6;
  uVar8 = (*(ulong *)&src->field_0x8 | uVar1) & 0x2000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xffffffcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8;
  uVar9 = (*(ulong *)&src->field_0x8 | uVar1) & 0x100000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xffffefcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9;
  uVar10 = (*(ulong *)&src->field_0x8 | uVar1) & 0x200000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xffffcfcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10;
  uVar11 = (*(ulong *)&src->field_0x8 | uVar1) & 0x2000000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfffdcfcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11;
  uVar12 = (*(ulong *)&src->field_0x8 | uVar1) & 0x4000000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff9cfcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12;
  uVar13 = (*(ulong *)&src->field_0x8 | uVar1) & 0x400000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff98fcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12 | uVar13;
  uVar14 = (*(ulong *)&src->field_0x8 | uVar1) & 0x800000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff90fcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12 | uVar13 | uVar14;
  uVar15 = (*(ulong *)&src->field_0x8 | uVar1) & 0x1000000000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff80fcf1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
  uVar16 = (*(ulong *)&src->field_0x8 | uVar1) & 0x100000000;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff80fce1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16;
  *(ulong *)&dst->field_0x8 =
       uVar2 | uVar1 & 0xfff80fcc1fffffff | uVar7 | uVar4 | uVar5 | uVar6 | uVar8 | uVar9 | uVar10 |
       uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
       (uVar1 | *(ulong *)&src->field_0x8) & 0x200000000;
  return;
}

Assistant:

void HlslParseContext::mergeQualifiers(TQualifier& dst, const TQualifier& src)
{
    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
#define MERGE_SINGLETON(field) dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(nonUniform);
}